

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

int elf_identify(FFFuncs *ff,char *name,void *p,lword plen,uchar class,uchar endian,uint16_t machine
                ,uint32_t ver)

{
  bool bVar1;
  uint16_t uVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  char cVar6;
  char *in_RCX;
  ar_info *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  char in_R9B;
  uint16_t in_stack_00000008;
  uint in_stack_00000010;
  ar_info ai;
  Elf_CommonHdr *hdr;
  bool be;
  bool arflag;
  undefined4 in_stack_fffffffffffffe68;
  char *pcVar7;
  bool be_00;
  ar_info *in_stack_fffffffffffffec8;
  ar_info *local_50;
  ar_info *local_40;
  
  cVar6 = (char)in_R8D;
  bVar1 = false;
  if ((char *)0x17 < in_RCX) {
    pcVar7 = in_RCX;
    bVar3 = ar_init(in_RDX,in_RCX,CONCAT44(in_R8D,in_stack_fffffffffffffe68),(char *)0x124eee);
    be_00 = (bool)((ulong)pcVar7 >> 0x20);
    local_40 = in_RDX;
    if (bVar3 != 0) {
      bVar1 = true;
      bVar3 = ar_extract(in_stack_fffffffffffffec8);
      if (bVar3 == 0) {
        error(0x26,in_RSI);
        return -1;
      }
      local_40 = local_50;
    }
    if (((((cVar6 != '\x01') || ((char *)0x33 < in_RCX)) &&
         ((cVar6 != '\x02' || ((char *)0x3f < in_RCX)))) &&
        ((((iVar4 = strncmp((char *)local_40,ELFid,4), iVar4 == 0 &&
           (*(char *)((long)&local_40->arname + 4) == cVar6)) &&
          (*(char *)((long)&local_40->arname + 5) == in_R9B)) &&
         (((uint)*(byte *)((long)&local_40->arname + 6) == (in_stack_00000010 & 0xff) &&
          (uVar5 = read32(be_00,(void *)CONCAT44(in_R8D,in_stack_fffffffffffffe68)),
          uVar5 == in_stack_00000010)))))) &&
       (uVar2 = read16(be_00,(void *)CONCAT44(in_R8D,in_stack_fffffffffffffe68)),
       uVar2 == in_stack_00000008)) {
      uVar2 = read16(be_00,(void *)CONCAT44(in_R8D,in_stack_fffffffffffffe68));
      if (uVar2 == 1) {
        if (bVar1) {
          return 8;
        }
        return 1;
      }
      if (uVar2 == 2) {
        if (bVar1) {
          error(0x28,in_RSI,*in_RDI);
        }
        return 2;
      }
      if (uVar2 == 3) {
        if (bVar1) {
          error(0x27,in_RSI,*in_RDI);
        }
        return 4;
      }
      error(0x29,in_RSI,*in_RDI);
    }
  }
  return 0;
}

Assistant:

int elf_identify(struct FFFuncs *ff,char *name,void *p,
                 lword plen,unsigned char class,
                 unsigned char endian,uint16_t machine,uint32_t ver)
/* check a possible ELF file against the requirements, then */
/* return its type (object, library, shared object) */
{
  bool arflag = FALSE;
  bool be = (endian == ELFDATA2MSB);
  struct Elf_CommonHdr *hdr;
  struct ar_info ai;

  if (plen < sizeof(struct Elf_CommonHdr))
    return ID_UNKNOWN;

  if (ar_init(&ai,(char *)p,plen,name)) {
    /* library archive detected, extract 1st archive member */
    arflag = TRUE;
    if (!(ar_extract(&ai))) {
      error(38,name);  /* Empty archive ignored */
      return ID_IGNORE;
    }
    hdr = (struct Elf_CommonHdr *)ai.data;
  }
  else
    hdr = (struct Elf_CommonHdr *)p;

  if ((class==ELFCLASS32 && plen < sizeof(struct Elf32_Ehdr)) ||
      (class==ELFCLASS64 && plen < sizeof(struct Elf64_Ehdr)))
    return ID_UNKNOWN;

  if (!strncmp((char *)hdr->e_ident,ELFid,4)) {
    /* ELF identification found */
    if (hdr->e_ident[EI_CLASS]==class && hdr->e_ident[EI_DATA]==endian &&
        hdr->e_ident[EI_VERSION]==(unsigned char)ver &&
        read32(be,hdr->e_version)==ver && read16(be,hdr->e_machine)==machine) {
      switch (read16(be,hdr->e_type)) {
        case ET_REL:
          return arflag ? ID_LIBARCH : ID_OBJECT;
        case ET_EXEC:
          if (arflag) /* no executables in library archives */
            error(40,name,ff->tname);
          return ID_EXECUTABLE;
        case ET_DYN:
          if (arflag) /* no shared objects in library archives */
            error(39,name,ff->tname);
          return ID_SHAREDOBJ;
        default:
          error(41,name,ff->tname);  /* illegal fmt. / file corrupted */
          break;
      }
    }
  }

  return ID_UNKNOWN;
}